

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>
::val(value_type *__return_storage_ptr__,
     FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>
     *this)

{
  value_type local_50;
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> local_30;
  
  FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>_>_>_>,_Fad<Fad<double>_>_>
  ::val(&local_50,&this->left_->fadexpr_);
  local_30.fadexpr_.right_.constant_ = (this->right_).constant_;
  local_30.fadexpr_.right_.defaultVal = 0.0;
  local_30.fadexpr_.left_ = &local_50;
  Fad<double>::Fad<FadBinaryMinus<Fad<double>,FadCst<double>>>(__return_storage_ptr__,&local_30);
  Fad<double>::~Fad(&local_50);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}